

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::objValueReal(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int32_t iVar4;
  double a;
  
  if (this->_status == INFEASIBLE) {
    a = (double)this->_currentSettings->_intParamValues[0] *
        -this->_currentSettings->_realParamValues[6];
  }
  else {
    if (this->_status != UNBOUNDED) {
      if (((this->_hasSolReal | this->_hasSolRational) & 1U) != 0) {
        if (((this->_hasSolReal | ~this->_hasSolRational) & 1U) == 0) {
          SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       *)&this->_solReal,&this->_solRational);
          this->_hasSolReal = true;
        }
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             *(undefined8 *)((this->_solReal)._objVal.m_backend.data._M_elems + 8);
        uVar1 = *(undefined8 *)(this->_solReal)._objVal.m_backend.data._M_elems;
        uVar2 = *(undefined8 *)((this->_solReal)._objVal.m_backend.data._M_elems + 2);
        uVar3 = *(undefined8 *)((this->_solReal)._objVal.m_backend.data._M_elems + 6);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             *(undefined8 *)((this->_solReal)._objVal.m_backend.data._M_elems + 4);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar3;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar1;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar2;
        (__return_storage_ptr__->m_backend).exp = (this->_solReal)._objVal.m_backend.exp;
        (__return_storage_ptr__->m_backend).neg = (this->_solReal)._objVal.m_backend.neg;
        iVar4 = (this->_solReal)._objVal.m_backend.prec_elem;
        (__return_storage_ptr__->m_backend).fpclass = (this->_solReal)._objVal.m_backend.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = iVar4;
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
      (__return_storage_ptr__->m_backend).prec_elem = 10;
      (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
      (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
      *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
      *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
      a = 0.0;
      goto LAB_0036202e;
    }
    a = (double)this->_currentSettings->_intParamValues[0] *
        this->_currentSettings->_realParamValues[6];
  }
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
LAB_0036202e:
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,a);
  return __return_storage_ptr__;
}

Assistant:

R SoPlexBase<R>::objValueReal()
{
   assert(OBJSENSE_MAXIMIZE == 1);
   assert(OBJSENSE_MINIMIZE == -1);

   if(status() == SPxSolverBase<R>::UNBOUNDED)
      return realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(status() == SPxSolverBase<R>::INFEASIBLE)
      return -realParam(SoPlexBase<R>::INFTY) * intParam(SoPlexBase<R>::OBJSENSE);
   else if(hasSol())
   {
      _syncRealSolution();
      return _solReal._objVal;
   }
   else
      return 0.0;
}